

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_2::DeepScanLineOutputFile::initialize(DeepScanLineOutputFile *this,Header *header)

{
  Format FVar1;
  int iVar2;
  Header *hdr;
  LineOrder *pLVar3;
  int *piVar4;
  LineBuffer *pLVar5;
  value_type size;
  reference ppLVar6;
  Compressor *pCVar7;
  size_t in_RSI;
  Header *in_RDI;
  size_t i;
  int lineOffsetSize;
  Compressor *compressor;
  Box2i *dataWindow;
  string *in_stack_00000118;
  Header *in_stack_00000120;
  Compressor *in_stack_ffffffffffffff90;
  long in_stack_ffffffffffffff98;
  Array<unsigned_int> *in_stack_ffffffffffffffa0;
  Compressor *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar8;
  Header *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffcc;
  LineBuffer *this_00;
  LineBuffer *this_01;
  int local_28;
  int local_24;
  Compressor *local_20;
  Header *pHVar9;
  
  pHVar9 = in_RDI;
  Header::operator=(in_stack_ffffffffffffffc0,in_RDI);
  Header::setType(in_stack_00000120,in_stack_00000118);
  hdr = (Header *)Header::dataWindow((Header *)0x1a31b5);
  pLVar3 = Header::lineOrder((Header *)0x1a31c4);
  if (*pLVar3 == INCREASING_Y) {
    iVar8 = *(int *)&(hdr->_map)._M_t._M_impl.field_0x4;
  }
  else {
    iVar8 = *(int *)&(hdr->_map)._M_t._M_impl.super__Rb_tree_header._M_header.field_0x4;
  }
  *(int *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header + 0xb0) = iVar8;
  *(int *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header + 0xb4) =
       (*(int *)&(hdr->_map)._M_t._M_impl.super__Rb_tree_header._M_header.field_0x4 -
       *(int *)&(hdr->_map)._M_t._M_impl.field_0x4) + 1;
  pLVar3 = Header::lineOrder((Header *)0x1a321d);
  *(LineOrder *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header + 0xb8) =
       *pLVar3;
  *(int *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header + 0xbc) =
       *(int *)&(hdr->_map)._M_t._M_impl;
  *(_Rb_tree_color *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header + 0xc0)
       = (hdr->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
  *(int *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header + 0xc4) =
       *(int *)&(hdr->_map)._M_t._M_impl.field_0x4;
  *(undefined4 *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header + 200) =
       *(undefined4 *)&(hdr->_map)._M_t._M_impl.super__Rb_tree_header._M_header.field_0x4;
  Array<unsigned_int>::resizeErase(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  Header::compression((Header *)0x1a32ad);
  local_20 = newCompressor((Compression)((ulong)pHVar9 >> 0x20),in_RSI,hdr);
  FVar1 = defaultFormat(in_stack_ffffffffffffff90);
  *(Format *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header + 0x100) = FVar1
  ;
  iVar2 = numLinesInBuffer(in_stack_ffffffffffffff90);
  *(int *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header + 0x140) = iVar2;
  if ((local_20 != (Compressor *)0x0) &&
     (in_stack_ffffffffffffffa8 = local_20, local_20 != (Compressor *)0x0)) {
    (*local_20->_vptr_Compressor[1])();
  }
  local_24 = ((*(int *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header + 200)
              - *(int *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header +
                        0xc4)) +
             *(int *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header + 0x140)
             ) / *(int *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header +
                         0x140);
  Header::setChunkCount(in_stack_ffffffffffffffc0,(int)((ulong)in_RDI >> 0x20));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(iVar8,in_stack_ffffffffffffffb0),(size_type)in_stack_ffffffffffffffa8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(iVar8,in_stack_ffffffffffffffb0),(size_type)in_stack_ffffffffffffffa8);
  local_28 = (*(int *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header + 200)
             - *(int *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header + 0xc4
                       )) + 1;
  piVar4 = std::min<int>((int *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header.
                                           _M_header + 0x140),&local_28);
  *(long *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header + 0x168) =
       (long)(*piVar4 *
             ((*(int *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header + 0xc0
                       ) -
              *(int *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header + 0xbc)
              ) + 1)) << 2;
  this_00 = (LineBuffer *)0x0;
  while (this_01 = this_00,
        pLVar5 = (LineBuffer *)
                 std::
                 vector<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
                 ::size((vector<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
                         *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header +
                           0x128)), this_00 < pLVar5) {
    size = (value_type)operator_new(200);
    anon_unknown_6::LineBuffer::LineBuffer(this_01,in_stack_ffffffffffffffcc);
    ppLVar6 = std::
              vector<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
              ::operator[]((vector<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
                            *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header
                              + 0x128),(size_type)this_01);
    *ppLVar6 = size;
    std::
    vector<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
    ::operator[]((vector<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
                  *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header + 0x128),
                 (size_type)this_01);
    Array<char>::resizeErase((Array<char> *)this_00,(long)size);
    Header::compression((Header *)0x1a34ee);
    pCVar7 = newCompressor((Compression)((ulong)pHVar9 >> 0x20),in_RSI,hdr);
    ppLVar6 = std::
              vector<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
              ::operator[]((vector<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
                            *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header
                              + 0x128),(size_type)this_01);
    *(Compressor **)((long)&((*ppLVar6)->exception).field_2 + 8) = pCVar7;
    this_00 = (LineBuffer *)((long)&this_01->uncompressedData + 1);
  }
  return;
}

Assistant:

void
DeepScanLineOutputFile::initialize (const Header& header)
{
    _data->header = header;

    _data->header.setType (DEEPSCANLINE);

    const Box2i& dataWindow = header.dataWindow ();

    _data->currentScanLine = (header.lineOrder () == INCREASING_Y)
                                 ? dataWindow.min.y
                                 : dataWindow.max.y;

    _data->missingScanLines = dataWindow.max.y - dataWindow.min.y + 1;
    _data->lineOrder        = header.lineOrder ();
    _data->minX             = dataWindow.min.x;
    _data->maxX             = dataWindow.max.x;
    _data->minY             = dataWindow.min.y;
    _data->maxY             = dataWindow.max.y;

    _data->lineSampleCount.resizeErase (_data->maxY - _data->minY + 1);

    Compressor* compressor =
        newCompressor (_data->header.compression (), 0, _data->header);
    _data->format        = defaultFormat (compressor);
    _data->linesInBuffer = numLinesInBuffer (compressor);
    if (compressor != 0) delete compressor;

    int lineOffsetSize = (_data->maxY - _data->minY + _data->linesInBuffer) /
                         _data->linesInBuffer;

    _data->header.setChunkCount (lineOffsetSize);

    _data->lineOffsets.resize (lineOffsetSize);

    _data->bytesPerLine.resize (_data->maxY - _data->minY + 1);

    _data->maxSampleCountTableSize =
        min (_data->linesInBuffer, _data->maxY - _data->minY + 1) *
        (_data->maxX - _data->minX + 1) * sizeof (unsigned int);

    for (size_t i = 0; i < _data->lineBuffers.size (); ++i)
    {
        _data->lineBuffers[i] = new LineBuffer (_data->linesInBuffer);
        _data->lineBuffers[i]->sampleCountTableBuffer.resizeErase (
            static_cast<long> (_data->maxSampleCountTableSize));

        _data->lineBuffers[i]->sampleCountTableCompressor = newCompressor (
            _data->header.compression (),
            _data->maxSampleCountTableSize,
            _data->header);
    }
}